

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleJitProfilingHelpers.cpp
# Opt level: O0

void Js::SimpleJitHelpers::StoreArrayHelper(Var arr,uint32 index,Var value)

{
  TypeId TVar1;
  JavascriptArray *this;
  ThreadContext *threadContext;
  ScriptContext *pSVar2;
  undefined1 local_50 [4];
  TypeId typeId;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext;
  JavascriptArray *array;
  Var value_local;
  uint32 index_local;
  Var arr_local;
  
  this = Js::JavascriptArray::FromAnyArray(arr);
  reentrancylock._24_8_ = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  threadContext = ScriptContext::GetThreadContext((ScriptContext *)reentrancylock._24_8_);
  JsReentLock::JsReentLock((JsReentLock *)local_50,threadContext);
  TVar1 = RecyclableObject::GetTypeId((RecyclableObject *)this);
  if (TVar1 == TypeIds_NativeIntArray) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    Js::JavascriptArray::OP_SetNativeIntElementC
              ((JavascriptNativeIntArray *)this,index,value,pSVar2);
  }
  else if (TVar1 == TypeIds_ArrayLast) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    Js::JavascriptArray::OP_SetNativeFloatElementC
              ((JavascriptNativeFloatArray *)this,index,value,pSVar2);
  }
  else {
    Js::JavascriptArray::SetArrayLiteralItem<void*>(this,index,value);
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_50);
  return;
}

Assistant:

void SimpleJitHelpers::StoreArrayHelper(Var arr, uint32 index, Var value)
    {
        //Adapted from InterpreterStackFrame::OP_SetArrayItemC_CI4
        JavascriptArray* array = JavascriptArray::FromAnyArray(arr);
        ScriptContext* scriptContext = array->GetScriptContext();
        JIT_HELPER_NOT_REENTRANT_HEADER(SimpleStoreArrayHelper, reentrancylock, scriptContext->GetThreadContext());

        TypeId typeId = array->GetTypeId();
        if (typeId == TypeIds_NativeIntArray)
        {
            JavascriptArray::OP_SetNativeIntElementC(reinterpret_cast<JavascriptNativeIntArray*>(array), index, value, array->GetScriptContext());
        }
        else if (typeId == TypeIds_NativeFloatArray)
        {
            JavascriptArray::OP_SetNativeFloatElementC(reinterpret_cast<JavascriptNativeFloatArray*>(array), index, value, array->GetScriptContext());
        }
        else
        {
            array->SetArrayLiteralItem(index, value);
        }
        JIT_HELPER_END(SimpleStoreArrayHelper);
    }